

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

idx_t duckdb::UpdateValidityStatistics
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  if (((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
       (unsigned_long *)0x0) &&
     (bVar3 = BaseStatistics::CanHaveNull(&stats->statistics), count != 0 && !bVar3)) {
    puVar1 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    psVar2 = update->sel->sel_vector;
    iVar4 = 0;
    do {
      iVar5 = iVar4;
      if (psVar2 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar2[iVar4];
      }
      if ((puVar1 != (unsigned_long *)0x0) && ((puVar1[iVar5 >> 6] >> (iVar5 & 0x3f) & 1) == 0)) {
        (stats->statistics).has_null = true;
        break;
      }
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  this = (sel->selection_data).internal.
         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (sel->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (sel->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  sel->sel_vector = (sel_t *)0x0;
  return count;
}

Assistant:

idx_t UpdateValidityStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                               idx_t count, SelectionVector &sel) {
	auto &mask = update.validity;
	auto &validity = stats.statistics;
	if (!mask.AllValid() && !validity.CanHaveNull()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (!mask.RowIsValid(idx)) {
				validity.SetHasNullFast();
				break;
			}
		}
	}
	sel.Initialize(nullptr);
	return count;
}